

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

int read_Bools(archive_read *a,uchar *data,size_t num)

{
  uint uVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = 0;
  uVar1 = 0;
  uVar3 = 0;
  do {
    if (num <= uVar4) {
      return 0;
    }
    if (uVar1 == 0) {
      pbVar2 = header_bytes(a,1);
      if (pbVar2 == (byte *)0x0) {
        return -1;
      }
      uVar3 = (uint)*pbVar2;
      uVar1 = 0x80;
    }
    data[uVar4] = (uVar3 & uVar1) != 0;
    uVar1 = uVar1 >> 1;
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

static int
read_Bools(struct archive_read *a, unsigned char *data, size_t num)
{
	const unsigned char *p;
	unsigned i, mask = 0, avail = 0;

	for (i = 0; i < num; i++) {
		if (mask == 0) {
			if ((p = header_bytes(a, 1)) == NULL)
				return (-1);
			avail = *p;
			mask = 0x80;
		}
		data[i] = (avail & mask)?1:0;
		mask >>= 1;
	}
	return (0);
}